

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CudaConfig.cpp
# Opt level: O3

Value __thiscall xmrig::CudaConfig::toJSON(CudaConfig *this,Document *doc)

{
  MemoryPoolAllocator<rapidjson::CrtAllocator> *allocator;
  Document *in_RDX;
  undefined8 extraout_RDX;
  Value VVar1;
  Data local_48;
  Data local_38;
  
  allocator = in_RDX->allocator_;
  this->m_enabled = false;
  this->m_shouldSave = false;
  *(undefined6 *)&this->field_0x2 = 0;
  (this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  *(undefined2 *)
   ((long)&(this->m_devicesHint).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
           _M_impl.super__Vector_impl_data._M_start + 6) = 3;
  local_48.s.str = (Ch *)0x405000000188227;
  local_48.n = (Number)0x7;
  local_38.n = (Number)0x0;
  local_38.s.str =
       (Ch *)((ulong)(ushort)((byte)(doc->
                                    super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                    ).data_.ss.str[0] + 9) << 0x30);
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_48.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_38.s,allocator);
  String::toJSON((String *)&local_48.s);
  local_38.s.str = (Ch *)0x405000000188335;
  local_38.n = (Number)0x6;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                     *)&local_38.s,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)&local_48.s,allocator);
  if (doc[1].allocator_ == (MemoryPoolAllocator<rapidjson::CrtAllocator> *)0x0) {
    local_48.s.str = (Ch *)0x40500000018834c;
    local_48.n.i64 = (Number)0x4;
    local_38.n.i64 = (Number)0x0;
    local_38.s.str =
         (Ch *)((ulong)(ushort)((byte)doc[1].
                                      super_GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                                      .data_.ss.str[8] + 9) << 0x30);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_48.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_38.s,allocator);
  }
  else {
    String::toJSON((String *)&local_48.s);
    local_38.s.str = (Ch *)0x40500000018834c;
    local_38.n = (Number)0x4;
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)this,(GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)&local_38.s,
              (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)&local_48.s,allocator);
  }
  Threads<xmrig::CudaThreads>::toJSON
            ((Threads<xmrig::CudaThreads> *)&(doc->stack_).stack_,(Value *)this,in_RDX);
  VVar1.data_.s.str = (Ch *)extraout_RDX;
  VVar1.data_.n = (Number)this;
  return (Value)VVar1.data_;
}

Assistant:

rapidjson::Value xmrig::CudaConfig::toJSON(rapidjson::Document &doc) const
{
    using namespace rapidjson;
    auto &allocator = doc.GetAllocator();

    Value obj(kObjectType);

    obj.AddMember(StringRef(kEnabled),  m_enabled, allocator);
    obj.AddMember(StringRef(kLoader),   m_loader.toJSON(), allocator);

#   ifdef XMRIG_FEATURE_NVML
    if (m_nvmlLoader.isNull()) {
        obj.AddMember(StringRef(kNvml), m_nvml, allocator);
    }
    else {
        obj.AddMember(StringRef(kNvml), m_nvmlLoader.toJSON(), allocator);
    }
#   endif

    m_threads.toJSON(obj, doc);

    return obj;
}